

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O0

void __thiscall
flatbuffers::python::PythonGenerator::GenUnPackForStructVector
          (PythonGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr)

{
  char cVar1;
  char *pcVar2;
  string local_6e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_680;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_660;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_640;
  string local_620;
  string local_600;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  string local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  string local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  string local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  string local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  undefined1 local_300 [8];
  string package_reference;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> one_instance;
  string field_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  string local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  string local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [8];
  string struct_var;
  undefined1 local_70 [8];
  string field_method;
  string field_field;
  string *code;
  string *code_ptr_local;
  FieldDef *field_local;
  StructDef *struct_def_local;
  PythonGenerator *this_local;
  
  IdlNamer::Field_abi_cxx11_((string *)((long)&field_method.field_2 + 8),&this->namer_,field);
  Namer::Method<flatbuffers::FieldDef>((string *)local_70,&(this->namer_).super_Namer,field);
  IdlNamer::Variable_abi_cxx11_((string *)local_a0,&this->namer_,struct_def);
  GenIndents_abi_cxx11_(&local_160,this,2);
  std::operator+(&local_140,&local_160,"if not ");
  std::operator+(&local_120,&local_140,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
  std::operator+(&local_100,&local_120,".");
  std::operator+(&local_e0,&local_100,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
  std::operator+(&local_c0,&local_e0,"IsNone():");
  std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_160);
  GenIndents_abi_cxx11_(&local_1e0,this,3);
  std::operator+(&local_1c0,&local_1e0,"self.");
  std::operator+(&local_1a0,&local_1c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&field_method.field_2 + 8));
  std::operator+(&local_180,&local_1a0," = []");
  std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1e0);
  GenIndents_abi_cxx11_((string *)((long)&field_type.field_2 + 8),this,3);
  std::operator+(&local_280,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&field_type.field_2 + 8),"for i in range(");
  std::operator+(&local_260,&local_280,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
  std::operator+(&local_240,&local_260,".");
  std::operator+(&local_220,&local_240,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
  std::operator+(&local_200,&local_220,"Length()):");
  std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)(field_type.field_2._M_local_buf + 8));
  TypeName_abi_cxx11_((string *)((long)&one_instance.field_2 + 8),this,field);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&package_reference.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&one_instance.field_2 + 8),"_");
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)((long)&package_reference.field_2 + 8));
  cVar1 = CharToLower(*pcVar2);
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)((long)&package_reference.field_2 + 8));
  *pcVar2 = cVar1;
  if (((((this->super_BaseGenerator).parser_)->opts).include_dependence_headers & 1U) != 0) {
    GenPackageReference_abi_cxx11_((string *)local_300,this,&(field->value).type);
    std::operator+(&local_340,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_300,
                   ".");
    TypeName_abi_cxx11_(&local_360,this,field);
    std::operator+(&local_320,&local_340,&local_360);
    std::__cxx11::string::operator=
              ((string *)(one_instance.field_2._M_local_buf + 8),(string *)&local_320);
    std::__cxx11::string::~string((string *)&local_320);
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::~string((string *)&local_340);
    std::__cxx11::string::~string((string *)local_300);
  }
  GenIndents_abi_cxx11_(&local_420,this,4);
  std::operator+(&local_400,&local_420,"if ");
  std::operator+(&local_3e0,&local_400,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
  std::operator+(&local_3c0,&local_3e0,".");
  std::operator+(&local_3a0,&local_3c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
  std::operator+(&local_380,&local_3a0,"(i) is None:");
  std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_380);
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::~string((string *)&local_400);
  std::__cxx11::string::~string((string *)&local_420);
  GenIndents_abi_cxx11_(&local_4a0,this,5);
  std::operator+(&local_480,&local_4a0,"self.");
  std::operator+(&local_460,&local_480,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&field_method.field_2 + 8));
  std::operator+(&local_440,&local_460,".append(None)");
  std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_440);
  std::__cxx11::string::~string((string *)&local_440);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  std::__cxx11::string::~string((string *)&local_4a0);
  GenIndents_abi_cxx11_(&local_4e0,this,4);
  std::operator+(&local_4c0,&local_4e0,"else:");
  std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_4c0);
  std::__cxx11::string::~string((string *)&local_4c0);
  std::__cxx11::string::~string((string *)&local_4e0);
  GenIndents_abi_cxx11_(&local_600,this,5);
  std::operator+(&local_5e0,&local_600,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&package_reference.field_2 + 8));
  std::operator+(&local_5c0,&local_5e0," = ");
  Namer::ObjectType(&local_620,&(this->namer_).super_Namer,
                    (string *)((long)&one_instance.field_2 + 8));
  std::operator+(&local_5a0,&local_5c0,&local_620);
  std::operator+(&local_580,&local_5a0,".InitFromObj(");
  std::operator+(&local_560,&local_580,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
  std::operator+(&local_540,&local_560,".");
  std::operator+(&local_520,&local_540,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
  std::operator+(&local_500,&local_520,"(i))");
  std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_500);
  std::__cxx11::string::~string((string *)&local_500);
  std::__cxx11::string::~string((string *)&local_520);
  std::__cxx11::string::~string((string *)&local_540);
  std::__cxx11::string::~string((string *)&local_560);
  std::__cxx11::string::~string((string *)&local_580);
  std::__cxx11::string::~string((string *)&local_5a0);
  std::__cxx11::string::~string((string *)&local_620);
  std::__cxx11::string::~string((string *)&local_5c0);
  std::__cxx11::string::~string((string *)&local_5e0);
  std::__cxx11::string::~string((string *)&local_600);
  GenIndents_abi_cxx11_(&local_6e0,this,5);
  std::operator+(&local_6c0,&local_6e0,"self.");
  std::operator+(&local_6a0,&local_6c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&field_method.field_2 + 8));
  std::operator+(&local_680,&local_6a0,".append(");
  std::operator+(&local_660,&local_680,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&package_reference.field_2 + 8));
  std::operator+(&local_640,&local_660,")");
  std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_640);
  std::__cxx11::string::~string((string *)&local_640);
  std::__cxx11::string::~string((string *)&local_660);
  std::__cxx11::string::~string((string *)&local_680);
  std::__cxx11::string::~string((string *)&local_6a0);
  std::__cxx11::string::~string((string *)&local_6c0);
  std::__cxx11::string::~string((string *)&local_6e0);
  std::__cxx11::string::~string((string *)(package_reference.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(one_instance.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)(field_method.field_2._M_local_buf + 8));
  return;
}

Assistant:

void GenUnPackForStructVector(const StructDef &struct_def,
                                const FieldDef &field,
                                std::string *code_ptr) const {
    auto &code = *code_ptr;
    const auto field_field = namer_.Field(field);
    const auto field_method = namer_.Method(field);
    const auto struct_var = namer_.Variable(struct_def);

    code += GenIndents(2) + "if not " + struct_var + "." + field_method +
            "IsNone():";
    code += GenIndents(3) + "self." + field_field + " = []";
    code += GenIndents(3) + "for i in range(" + struct_var + "." +
            field_method + "Length()):";

    auto field_type = TypeName(field);
    auto one_instance = field_type + "_";
    one_instance[0] = CharToLower(one_instance[0]);
    if (parser_.opts.include_dependence_headers) {
      auto package_reference = GenPackageReference(field.value.type);
      field_type = package_reference + "." + TypeName(field);
    }
    code += GenIndents(4) + "if " + struct_var + "." + field_method +
            "(i) is None:";
    code += GenIndents(5) + "self." + field_field + ".append(None)";
    code += GenIndents(4) + "else:";
    code += GenIndents(5) + one_instance + " = " +
            namer_.ObjectType(field_type) + ".InitFromObj(" + struct_var + "." +
            field_method + "(i))";
    code +=
        GenIndents(5) + "self." + field_field + ".append(" + one_instance + ")";
  }